

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void load_buffer_8x4(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  int16_t *topL;
  __m128i alVar4;
  __m128i alVar5;
  undefined1 auVar6 [16];
  __m128i alVar7;
  __m128i alVar8;
  __m128i alVar9;
  __m128i alVar10;
  undefined1 auVar11 [16];
  __m128i alVar12;
  __m128i alVar13;
  __m128i alVar14;
  __m128i alVar15;
  undefined1 auVar16 [16];
  __m128i alVar17;
  __m128i alVar18;
  undefined1 in_XMM4 [16];
  undefined1 auVar19 [16];
  
  puVar2 = (ulong *)(input + 4);
  if (fliplr == 0) {
    if (flipud == 0) {
      alVar5[1] = 0;
      alVar5[0] = *(ulong *)input;
      *out = alVar5;
      alVar10[1] = 0;
      alVar10[0] = *(ulong *)(input + stride);
      out[1] = alVar10;
      uVar1 = *(ulong *)(input + stride * 2);
      input = input + stride * 3;
    }
    else {
      alVar5[1] = 0;
      alVar5[0] = *(ulong *)(input + stride * 3);
      *out = alVar5;
      alVar10[1] = 0;
      alVar10[0] = *(ulong *)(input + stride * 2);
      out[1] = alVar10;
      uVar1 = *(ulong *)(input + stride);
    }
    alVar15[1] = 0;
    alVar15[0] = uVar1;
    out[2] = alVar15;
    auVar19 = pmovsxwd(in_XMM4,*(undefined8 *)input);
    auVar6 = pmovsxwd((undefined1  [16])alVar5,(undefined1  [16])alVar5);
    auVar11 = pmovsxwd((undefined1  [16])alVar10,(undefined1  [16])alVar10);
    auVar16 = pmovsxwd((undefined1  [16])alVar15,(undefined1  [16])alVar15);
    *(int *)*out = auVar6._0_4_ << shift;
    *(int *)((long)*out + 4) = auVar6._4_4_;
    *(int *)(*out + 1) = auVar6._8_4_;
    *(int *)((long)*out + 0xc) = auVar6._12_4_;
    *(int *)out[1] = auVar11._0_4_ << shift;
    *(int *)((long)out[1] + 4) = auVar11._4_4_;
    *(int *)(out[1] + 1) = auVar11._8_4_;
    *(int *)((long)out[1] + 0xc) = auVar11._12_4_;
    *(int *)out[2] = auVar16._0_4_ << shift;
    *(int *)((long)out[2] + 4) = auVar16._4_4_;
    *(int *)(out[2] + 1) = auVar16._8_4_;
    *(int *)((long)out[2] + 0xc) = auVar16._12_4_;
    *(int *)out[3] = auVar19._0_4_ << shift;
    *(int *)((long)out[3] + 4) = auVar19._4_4_;
    *(int *)(out[3] + 1) = auVar19._8_4_;
    *(int *)((long)out[3] + 0xc) = auVar19._12_4_;
    if (flipud == 0) {
      alVar8[1] = 0;
      alVar8[0] = *puVar2;
      out[4] = alVar8;
      alVar13[1] = 0;
      alVar13[0] = *(ulong *)((long)puVar2 + (long)stride * 2);
      out[5] = alVar13;
      uVar1 = *(ulong *)((long)puVar2 + (long)(stride * 2) * 2);
      puVar2 = (ulong *)((long)puVar2 + (long)(stride * 3) * 2);
    }
    else {
      alVar8[1] = 0;
      alVar8[0] = *(ulong *)((long)puVar2 + (long)(stride * 3) * 2);
      out[4] = alVar8;
      alVar13[1] = 0;
      alVar13[0] = *(ulong *)((long)puVar2 + (long)(stride * 2) * 2);
      out[5] = alVar13;
      uVar1 = *(ulong *)((long)puVar2 + (long)stride * 2);
    }
    alVar18[1] = 0;
    alVar18[0] = uVar1;
    out[6] = alVar18;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *puVar2;
  }
  else {
    lVar3 = (long)stride;
    if (flipud == 0) {
      alVar4[1] = 0;
      alVar4[0] = *puVar2;
      *out = alVar4;
      alVar9[1] = 0;
      alVar9[0] = *(ulong *)((long)puVar2 + lVar3 * 2);
      out[1] = alVar9;
      uVar1 = *(ulong *)((long)puVar2 + (long)(stride * 2) * 2);
      puVar2 = (ulong *)((long)puVar2 + (long)(stride * 3) * 2);
    }
    else {
      alVar4[1] = 0;
      alVar4[0] = *(ulong *)((long)puVar2 + (long)(stride * 3) * 2);
      *out = alVar4;
      alVar9[1] = 0;
      alVar9[0] = *(ulong *)((long)puVar2 + (long)(stride * 2) * 2);
      out[1] = alVar9;
      uVar1 = *(ulong *)((long)puVar2 + lVar3 * 2);
    }
    alVar14[1] = 0;
    alVar14[0] = uVar1;
    out[2] = alVar14;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *puVar2;
    auVar6 = pshuflw((undefined1  [16])alVar4,(undefined1  [16])alVar4,0x1b);
    auVar6 = pmovsxwd(auVar6,auVar6);
    auVar11 = pshuflw((undefined1  [16])alVar9,(undefined1  [16])alVar9,0x1b);
    auVar11 = pmovsxwd(auVar11,auVar11);
    auVar16 = pshuflw((undefined1  [16])alVar14,(undefined1  [16])alVar14,0x1b);
    auVar16 = pmovsxwd(auVar16,auVar16);
    auVar19 = pshuflw(auVar19,auVar19,0x1b);
    auVar19 = pmovsxwd(auVar19,auVar19);
    *(int *)*out = auVar6._0_4_ << shift;
    *(int *)((long)*out + 4) = auVar6._4_4_;
    *(int *)(*out + 1) = auVar6._8_4_;
    *(int *)((long)*out + 0xc) = auVar6._12_4_;
    *(int *)out[1] = auVar11._0_4_ << shift;
    *(int *)((long)out[1] + 4) = auVar11._4_4_;
    *(int *)(out[1] + 1) = auVar11._8_4_;
    *(int *)((long)out[1] + 0xc) = auVar11._12_4_;
    *(int *)out[2] = auVar16._0_4_ << shift;
    *(int *)((long)out[2] + 4) = auVar16._4_4_;
    *(int *)(out[2] + 1) = auVar16._8_4_;
    *(int *)((long)out[2] + 0xc) = auVar16._12_4_;
    *(int *)out[3] = auVar19._0_4_ << shift;
    *(int *)((long)out[3] + 4) = auVar19._4_4_;
    *(int *)(out[3] + 1) = auVar19._8_4_;
    *(int *)((long)out[3] + 0xc) = auVar19._12_4_;
    if (flipud == 0) {
      alVar7[1] = 0;
      alVar7[0] = *(ulong *)input;
      out[4] = alVar7;
      alVar12[1] = 0;
      alVar12[0] = *(ulong *)(input + lVar3);
      out[5] = alVar12;
      uVar1 = *(ulong *)(input + stride * 2);
      input = input + stride * 3;
    }
    else {
      alVar7[1] = 0;
      alVar7[0] = *(ulong *)(input + stride * 3);
      out[4] = alVar7;
      alVar12[1] = 0;
      alVar12[0] = *(ulong *)(input + stride * 2);
      out[5] = alVar12;
      uVar1 = *(ulong *)(input + lVar3);
    }
    alVar17[1] = 0;
    alVar17[0] = uVar1;
    out[6] = alVar17;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)input;
    alVar8 = (__m128i)pshuflw((undefined1  [16])alVar7,(undefined1  [16])alVar7,0x1b);
    alVar13 = (__m128i)pshuflw((undefined1  [16])alVar12,(undefined1  [16])alVar12,0x1b);
    alVar18 = (__m128i)pshuflw((undefined1  [16])alVar17,(undefined1  [16])alVar17,0x1b);
    auVar6 = pshuflw(auVar11,auVar11,0x1b);
  }
  auVar19 = pmovsxwd((undefined1  [16])alVar18,(undefined1  [16])alVar18);
  auVar16 = pmovsxwd((undefined1  [16])alVar13,(undefined1  [16])alVar13);
  auVar11 = pmovsxwd((undefined1  [16])alVar8,(undefined1  [16])alVar8);
  auVar6 = pmovsxwd(auVar6,auVar6);
  *(int *)out[4] = auVar11._0_4_ << shift;
  *(int *)((long)out[4] + 4) = auVar11._4_4_;
  *(int *)(out[4] + 1) = auVar11._8_4_;
  *(int *)((long)out[4] + 0xc) = auVar11._12_4_;
  *(int *)out[5] = auVar16._0_4_ << shift;
  *(int *)((long)out[5] + 4) = auVar16._4_4_;
  *(int *)(out[5] + 1) = auVar16._8_4_;
  *(int *)((long)out[5] + 0xc) = auVar16._12_4_;
  *(int *)out[6] = auVar19._0_4_ << shift;
  *(int *)((long)out[6] + 4) = auVar19._4_4_;
  *(int *)(out[6] + 1) = auVar19._8_4_;
  *(int *)((long)out[6] + 0xc) = auVar19._12_4_;
  *(int *)out[7] = auVar6._0_4_ << shift;
  *(int *)((long)out[7] + 4) = auVar6._4_4_;
  *(int *)(out[7] + 1) = auVar6._8_4_;
  *(int *)((long)out[7] + 0xc) = auVar6._12_4_;
  return;
}

Assistant:

static inline void load_buffer_8x4(const int16_t *input, __m128i *out,
                                   int stride, int flipud, int fliplr,
                                   int shift) {
  const int16_t *topL = input;
  const int16_t *topR = input + 4;

  const int16_t *tmp;

  if (fliplr) {
    tmp = topL;
    topL = topR;
    topR = tmp;
  }

  load_buffer_4x4(topL, out, stride, flipud, fliplr, shift);
  load_buffer_4x4(topR, out + 4, stride, flipud, fliplr, shift);
}